

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManFindGateGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
              Vec_Int_t *vUnatePairsW,word *pDivTempA,word *pDivTempB)

{
  uint iDiv;
  int iVar1;
  uint iDiv_00;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint local_44;
  
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    iVar8 = 0;
  }
  else {
    uVar3 = 0;
    iVar8 = 0;
    do {
      uVar5 = pOn[uVar3] - (pOn[uVar3] >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
      uVar5 = (uVar5 >> 8) + uVar5;
      lVar6 = (uVar5 >> 0x10) + uVar5;
      iVar8 = iVar8 + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (vUnatePairs->nSize < 1) {
    return -1;
  }
  lVar6 = 0;
LAB_0079cfd6:
  if (vUnatePairsW->nSize <= lVar6) {
LAB_0079d256:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iDiv = vUnatePairs->pArray[lVar6];
  if ((int)iDiv < 0) {
LAB_0079d275:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  iVar1 = vUnatePairsW->pArray[lVar6];
  iVar7 = 2;
  if (iVar8 <= iVar1 * 2) {
    Gia_ManDeriveDivPair(iDiv,vDivs,nWords,pDivTempA);
    lVar9 = lVar6;
LAB_0079d050:
    lVar9 = lVar9 + 1;
    iVar7 = 0;
    if (lVar9 < vUnatePairs->nSize) {
      if (lVar9 < vUnatePairsW->nSize) {
        iDiv_00 = vUnatePairs->pArray[lVar9];
        if (-1 < (int)iDiv_00) {
          iVar2 = 5;
          if (iVar8 <= vUnatePairsW->pArray[lVar9] + iVar1) {
            Gia_ManDeriveDivPair(iDiv_00,vDivs,nWords,pDivTempB);
            if ((iDiv_00 & 1) == 0 && (iDiv & 1) == 0) {
              if (0 < nWords) {
                uVar3 = 0;
                do {
                  if ((pOn[uVar3] & ~(pDivTempB[uVar3] | pDivTempA[uVar3])) != 0) goto LAB_0079d205;
                  uVar3 = uVar3 + 1;
                } while (uVar4 != uVar3);
              }
            }
            else if ((iDiv & 1) == 0) {
              if (0 < nWords) {
                uVar3 = 0;
                do {
                  if ((pOn[uVar3] & ~pDivTempA[uVar3] & pDivTempB[uVar3]) != 0) goto LAB_0079d205;
                  uVar3 = uVar3 + 1;
                } while (uVar4 != uVar3);
              }
            }
            else if ((iDiv_00 & 1) == 0) {
              if (0 < nWords) {
                uVar3 = 0;
                do {
                  if ((pOn[uVar3] & ~pDivTempB[uVar3] & pDivTempA[uVar3]) != 0) goto LAB_0079d205;
                  uVar3 = uVar3 + 1;
                } while (uVar4 != uVar3);
              }
            }
            else if (0 < nWords) {
              uVar3 = 0;
              do {
                if ((pOn[uVar3] & pDivTempB[uVar3] & pDivTempA[uVar3]) != 0) goto LAB_0079d205;
                uVar3 = uVar3 + 1;
              } while (uVar4 != uVar3);
            }
            if ((short)lVar9 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            local_44 = (int)lVar9 << 0x11 | (int)lVar6 * 4 | 0x10003;
            iVar2 = 1;
          }
          goto LAB_0079d207;
        }
        goto LAB_0079d275;
      }
      goto LAB_0079d256;
    }
  }
  goto LAB_0079d21c;
LAB_0079d205:
  iVar2 = 0;
LAB_0079d207:
  if (iVar2 != 0) goto code_r0x0079d20f;
  goto LAB_0079d050;
code_r0x0079d20f:
  iVar7 = 0;
  if (iVar2 != 5) {
    iVar7 = iVar2;
  }
LAB_0079d21c:
  if (iVar7 != 0) {
    if (iVar7 == 2) {
      return -1;
    }
    return local_44;
  }
  lVar6 = lVar6 + 1;
  if (vUnatePairs->nSize <= lVar6) {
    return -1;
  }
  goto LAB_0079cfd6;
}

Assistant:

int Gia_ManFindGateGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, word * pDivTempA, word * pDivTempB )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv0, Cover0, k )
    {
        int fCompA = Abc_LitIsCompl(iDiv0);
        if ( 2*Cover0 < nTotal )
            break;
        Gia_ManDeriveDivPair( iDiv0, vDivs, nWords, pDivTempA );
        Vec_IntForEachEntryTwoStart( vUnatePairs, vUnatePairsW, iDiv1, Cover1, i, k+1 )
        {
            int fCompB = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTempB );
            if ( Gia_ManDivCover(pOff, pOn, pDivTempA, fCompA, pDivTempB, fCompB, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(i, 1) << 15) | Abc_Var2Lit(k, 1), 1);
        }
    }
    return -1;
}